

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

string * __thiscall CInv::GetCommand_abi_cxx11_(CInv *this)

{
  out_of_range *this_00;
  uint *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  int masked;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff50);
  if ((*in_RSI & 0x40000000) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
  }
  switch(*in_RSI & 0x3fffffff) {
  case 1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::string(this_01,in_RDI);
    break;
  case 2:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::string(this_01,in_RDI);
    break;
  case 3:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::string(this_01,in_RDI);
    break;
  case 4:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::string(this_01,in_RDI);
    break;
  case 5:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
    std::__cxx11::string::string(this_01,in_RDI);
    break;
  default:
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    tinyformat::format<unsigned_int>(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::out_of_range::out_of_range(this_00,local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    goto LAB_00e16f0f;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
LAB_00e16f0f:
  __stack_chk_fail();
}

Assistant:

std::string CInv::GetCommand() const
{
    std::string cmd;
    if (type & MSG_WITNESS_FLAG)
        cmd.append("witness-");
    int masked = type & MSG_TYPE_MASK;
    switch (masked)
    {
    case MSG_TX:             return cmd.append(NetMsgType::TX);
    // WTX is not a message type, just an inv type
    case MSG_WTX:            return cmd.append("wtx");
    case MSG_BLOCK:          return cmd.append(NetMsgType::BLOCK);
    case MSG_FILTERED_BLOCK: return cmd.append(NetMsgType::MERKLEBLOCK);
    case MSG_CMPCT_BLOCK:    return cmd.append(NetMsgType::CMPCTBLOCK);
    default:
        throw std::out_of_range(strprintf("CInv::GetCommand(): type=%d unknown type", type));
    }
}